

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.h
# Opt level: O2

int av1_get_dy(int angle)

{
  uint uVar1;
  
  if (angle - 0x5bU < 0x59) {
    uVar1 = angle - 0x5a;
  }
  else {
    if (0x58 < angle - 0xb5U) {
      return 1;
    }
    uVar1 = 0x10e - angle;
  }
  return (int)dr_intra_derivative[uVar1];
}

Assistant:

static inline int av1_get_dy(int angle) {
  if (angle > 90 && angle < 180) {
    return dr_intra_derivative[angle - 90];
  } else if (angle > 180 && angle < 270) {
    return dr_intra_derivative[270 - angle];
  } else {
    // In this case, we are not really going to use dy. We may return any value.
    return 1;
  }
}